

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O0

void __thiscall
cmInstalledFile::AppendProperty
          (cmInstalledFile *this,cmMakefile *mf,string *prop,char *value,bool param_4)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  mapped_type *this_01;
  cmGeneratorExpression local_88;
  mapped_type *local_78;
  Property *property;
  cmListFileBacktrace local_60;
  undefined1 local_50 [8];
  cmGeneratorExpression ge;
  cmListFileBacktrace backtrace;
  bool param_4_local;
  char *value_local;
  string *prop_local;
  cmMakefile *mf_local;
  cmInstalledFile *this_local;
  
  this_00 = &ge.Backtrace.TopEntry.
             super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  cmMakefile::GetBacktrace((cmMakefile *)this_00);
  cmListFileBacktrace::cmListFileBacktrace(&local_60,(cmListFileBacktrace *)this_00);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_50,&local_60);
  cmListFileBacktrace::~cmListFileBacktrace(&local_60);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
            ::operator[](&this->Properties,prop);
  local_78 = this_01;
  cmGeneratorExpression::Parse(&local_88,local_50);
  local_88.Backtrace.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
         ::release((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                    *)&local_88);
  std::vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>::
  push_back(&this_01->ValueExpressions,
            (value_type *)
            &local_88.Backtrace.TopEntry.
             super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&local_88);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_50);
  cmListFileBacktrace::~cmListFileBacktrace
            ((cmListFileBacktrace *)
             &ge.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void cmInstalledFile::AppendProperty(cmMakefile const* mf,
                                     const std::string& prop,
                                     const char* value, bool /*asString*/)
{
  cmListFileBacktrace backtrace = mf->GetBacktrace();
  cmGeneratorExpression ge(backtrace);

  Property& property = this->Properties[prop];
  property.ValueExpressions.push_back(ge.Parse(value).release());
}